

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O0

void __thiscall
ki::dml::Field<unsigned_short>::set_value(Field<unsigned_short> *this,FieldBase *other)

{
  bool bVar1;
  unsigned_short value;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  char *pcVar4;
  value_error *this_00;
  Field<unsigned_short> *local_1e8;
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream oss;
  Field<unsigned_short> *real_other;
  FieldBase *other_local;
  Field<unsigned_short> *this_local;
  
  bVar1 = FieldBase::is_type<unsigned_short>(other);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar3 = std::operator<<((ostream *)local_198,"Tried to copy value from ");
    iVar2 = (*(other->super_Serializable)._vptr_Serializable[5])();
    poVar3 = std::operator<<(poVar3,(char *)CONCAT44(extraout_var,iVar2));
    poVar3 = std::operator<<(poVar3," field to ");
    pcVar4 = get_type_name(this);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::operator<<(poVar3," field.");
    this_00 = (value_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    value_error::value_error(this_00,local_1c8);
    __cxa_throw(this_00,&value_error::typeinfo,value_error::~value_error);
  }
  if (other == (FieldBase *)0x0) {
    local_1e8 = (Field<unsigned_short> *)0x0;
  }
  else {
    local_1e8 = (Field<unsigned_short> *)__dynamic_cast(other,&FieldBase::typeinfo,&typeinfo,0);
  }
  value = get_value(local_1e8);
  set_value(this,value);
  return;
}

Assistant:

void set_value(FieldBase *other) final
		{
			if (other->is_type<ValueT>())
			{
				auto *real_other = dynamic_cast<Field<ValueT> *>(other);
				set_value(real_other->get_value());
			}
			else
			{
				std::ostringstream oss;
				oss << "Tried to copy value from " <<
					other->get_type_name() << " field to " <<
					get_type_name() << " field.";
				throw value_error(oss.str());
			}
		}